

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosComm.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
adios2::helper::Comm::GetGathervDisplacements(size_t *counts,size_t countsSize)

{
  value_type vVar1;
  long lVar2;
  reference pvVar3;
  size_type in_RDX;
  long in_RSI;
  allocator_type *in_RDI;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *displacements;
  allocator_type *__a;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  ulong local_38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1a;
  
  local_1a.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._1_1_ = 0;
  this = &local_1a;
  __a = in_RDI;
  local_1a.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._2_8_ = in_RDX;
  local_1a.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._10_8_ = in_RSI;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x97f0ce);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(this,in_RDX,__a);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x97f0ee);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a,0);
  *pvVar3 = 0;
  for (local_38 = 1;
      local_38 <
      (ulong)local_1a.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._2_8_; local_38 = local_38 + 1) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a,local_38 - 1);
    vVar1 = *pvVar3;
    lVar2 = *(long *)(local_1a.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._10_8_ + (local_38 - 1) * 8);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a,local_38);
    *pvVar3 = vVar1 + lVar2;
  }
  return (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI;
}

Assistant:

std::vector<size_t> Comm::GetGathervDisplacements(const size_t *counts, const size_t countsSize)
{
    std::vector<size_t> displacements(countsSize);
    displacements[0] = 0;

    for (size_t i = 1; i < countsSize; ++i)
    {
        displacements[i] = displacements[i - 1] + counts[i - 1];
    }
    return displacements;
}